

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O1

void SimpleHFilter16_SSE2(uint8_t *p,int stride,int thresh)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  undefined1 auVar30 [14];
  unkbyte10 Var31;
  undefined1 auVar32 [14];
  unkbyte10 Var33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [14];
  undefined1 auVar36 [14];
  undefined1 auVar37 [12];
  undefined1 auVar38 [14];
  undefined1 auVar39 [12];
  long lVar40;
  uint8_t *puVar41;
  int iVar42;
  uint8_t *puVar43;
  uint8_t *puVar44;
  uint8_t *puVar45;
  undefined2 uVar46;
  undefined2 uVar68;
  undefined2 uVar69;
  undefined2 uVar72;
  undefined2 uVar73;
  undefined2 uVar74;
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar64 [16];
  undefined2 uVar75;
  undefined1 uVar88;
  undefined1 uVar90;
  __m128i t1;
  undefined1 uVar89;
  undefined1 uVar91;
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined2 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined1 auVar102 [16];
  undefined1 auVar112 [16];
  undefined1 auVar122 [16];
  __m128i t2;
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar148 [16];
  undefined1 uVar157;
  undefined1 uVar158;
  undefined1 uVar159;
  undefined1 uVar160;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  byte bVar168;
  byte bVar179;
  byte bVar180;
  byte bVar181;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar193 [16];
  undefined4 uVar47;
  undefined6 uVar48;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined8 uVar49;
  undefined1 auVar50 [12];
  undefined1 auVar51 [14];
  undefined1 auVar65 [16];
  undefined1 uVar66;
  undefined1 uVar67;
  undefined1 uVar70;
  undefined1 uVar71;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar103 [16];
  undefined1 auVar113 [16];
  undefined4 uVar95;
  undefined6 uVar96;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar98 [12];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar99 [12];
  undefined8 uVar97;
  undefined1 auVar100 [12];
  undefined1 auVar111 [16];
  undefined1 auVar121 [16];
  undefined1 auVar101 [14];
  undefined1 auVar123 [16];
  undefined1 uVar124;
  undefined1 uVar125;
  undefined1 uVar126;
  undefined1 uVar127;
  undefined1 auVar135 [16];
  undefined1 auVar129 [16];
  undefined1 auVar136 [16];
  undefined1 auVar130 [16];
  undefined1 auVar137 [16];
  undefined1 auVar131 [16];
  undefined1 auVar138 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar146 [16];
  undefined1 auVar143 [16];
  undefined1 auVar147 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 uVar165;
  undefined1 uVar166;
  undefined1 uVar167;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  
  puVar45 = p + -2;
  lVar40 = (long)stride;
  puVar41 = p + lVar40 * 8 + -2;
  puVar44 = p + lVar40 * 4 + -2;
  uVar47 = *(undefined4 *)(p + lVar40 * 2 + -2);
  uVar95 = *(undefined4 *)(p + lVar40 * 6 + -2);
  auVar164._0_8_ = CONCAT44(uVar95,uVar47);
  uVar1 = *(undefined4 *)puVar44;
  uVar2 = *(undefined4 *)(p + -2);
  auVar104._0_8_ = CONCAT44(uVar1,uVar2);
  uVar3 = *(undefined4 *)(p + lVar40 * 3 + -2);
  uVar4 = *(undefined4 *)(p + lVar40 * 7 + -2);
  uVar90 = (undefined1)((uint)uVar4 >> 0x18);
  uVar70 = (undefined1)((uint)uVar95 >> 0x18);
  auVar55._8_6_ = 0;
  auVar55._0_8_ = auVar164._0_8_;
  auVar55[0xe] = uVar70;
  auVar55[0xf] = uVar90;
  auVar54._14_2_ = auVar55._14_2_;
  auVar54._8_5_ = 0;
  auVar54._0_8_ = auVar164._0_8_;
  auVar54[0xd] = (char)((uint)uVar4 >> 0x10);
  auVar53._13_3_ = auVar54._13_3_;
  auVar53._8_4_ = 0;
  auVar53._0_8_ = auVar164._0_8_;
  auVar53[0xc] = (char)((uint)uVar95 >> 0x10);
  auVar52._12_4_ = auVar53._12_4_;
  auVar52._8_3_ = 0;
  auVar52._0_8_ = auVar164._0_8_;
  auVar52[0xb] = (char)((uint)uVar4 >> 8);
  auVar193._11_5_ = auVar52._11_5_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = auVar164._0_8_;
  auVar193[10] = (char)((uint)uVar95 >> 8);
  auVar182._10_6_ = auVar193._10_6_;
  auVar182[8] = 0;
  auVar182._0_8_ = auVar164._0_8_;
  auVar182[9] = (char)uVar4;
  auVar164._9_7_ = auVar182._9_7_;
  auVar164[8] = (char)uVar95;
  uVar88 = (undefined1)((uint)uVar3 >> 0x18);
  uVar66 = (undefined1)((uint)uVar47 >> 0x18);
  Var31 = CONCAT91(CONCAT81(auVar164._8_8_,uVar88),uVar66);
  auVar163._6_10_ = Var31;
  auVar163[5] = (char)((uint)uVar3 >> 0x10);
  auVar163[4] = (char)((uint)uVar47 >> 0x10);
  auVar163._0_4_ = uVar47;
  auVar30._2_12_ = auVar163._4_12_;
  auVar30[1] = (char)((uint)uVar3 >> 8);
  auVar30[0] = (char)((uint)uVar47 >> 8);
  uVar5 = *(undefined4 *)(p + lVar40 + -2);
  uVar6 = *(undefined4 *)(p + lVar40 * 5 + -2);
  uVar91 = (undefined1)((uint)uVar6 >> 0x18);
  uVar126 = (undefined1)((uint)uVar1 >> 0x18);
  auVar110._8_6_ = 0;
  auVar110._0_8_ = auVar104._0_8_;
  auVar110[0xe] = uVar126;
  auVar110[0xf] = uVar91;
  auVar109._14_2_ = auVar110._14_2_;
  auVar109._8_5_ = 0;
  auVar109._0_8_ = auVar104._0_8_;
  auVar109[0xd] = (char)((uint)uVar6 >> 0x10);
  auVar108._13_3_ = auVar109._13_3_;
  auVar108._8_4_ = 0;
  auVar108._0_8_ = auVar104._0_8_;
  auVar108[0xc] = (char)((uint)uVar1 >> 0x10);
  auVar107._12_4_ = auVar108._12_4_;
  auVar107._8_3_ = 0;
  auVar107._0_8_ = auVar104._0_8_;
  auVar107[0xb] = (char)((uint)uVar6 >> 8);
  auVar106._11_5_ = auVar107._11_5_;
  auVar106._8_2_ = 0;
  auVar106._0_8_ = auVar104._0_8_;
  auVar106[10] = (char)((uint)uVar1 >> 8);
  auVar105._10_6_ = auVar106._10_6_;
  auVar105[8] = 0;
  auVar105._0_8_ = auVar104._0_8_;
  auVar105[9] = (char)uVar6;
  auVar104._9_7_ = auVar105._9_7_;
  auVar104[8] = (char)uVar1;
  uVar89 = (undefined1)((uint)uVar5 >> 0x18);
  uVar124 = (undefined1)((uint)uVar2 >> 0x18);
  Var33 = CONCAT91(CONCAT81(auVar104._8_8_,uVar89),uVar124);
  auVar103._6_10_ = Var33;
  auVar103[5] = (char)((uint)uVar5 >> 0x10);
  auVar103[4] = (char)((uint)uVar2 >> 0x10);
  auVar103._0_4_ = uVar2;
  auVar32._2_12_ = auVar103._4_12_;
  auVar32[1] = (char)((uint)uVar5 >> 8);
  auVar32[0] = (char)((uint)uVar2 >> 8);
  auVar102._0_2_ = CONCAT11((char)uVar5,(char)uVar2);
  auVar102._2_14_ = auVar32;
  auVar131._0_12_ = auVar102._0_12_;
  auVar131._12_2_ = (short)Var33;
  auVar131._14_2_ = (short)Var31;
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._0_10_ = auVar102._0_10_;
  auVar130._10_2_ = auVar163._4_2_;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._0_8_ = auVar102._0_8_;
  auVar129._8_2_ = auVar103._4_2_;
  auVar34._4_8_ = auVar129._8_8_;
  auVar34._2_2_ = auVar30._0_2_;
  auVar34._0_2_ = auVar32._0_2_;
  auVar128._0_4_ = CONCAT22(CONCAT11((char)uVar3,(char)uVar47),auVar102._0_2_);
  auVar128._4_12_ = auVar34;
  uVar93 = CONCAT22(auVar164._8_2_,auVar104._8_2_);
  auVar98._0_8_ = CONCAT26(auVar193._10_2_,CONCAT24(auVar106._10_2_,uVar93));
  auVar98._8_2_ = auVar108._12_2_;
  auVar98._10_2_ = auVar53._12_2_;
  auVar111._12_2_ = auVar109._14_2_;
  auVar111._0_12_ = auVar98;
  auVar111._14_2_ = auVar54._14_2_;
  auVar77._0_8_ = auVar128._0_8_;
  auVar77._8_4_ = auVar34._0_4_;
  auVar77._12_4_ = (int)((ulong)auVar98._0_8_ >> 0x20);
  auVar76._8_8_ = auVar77._8_8_;
  auVar76._0_8_ = CONCAT44(uVar93,auVar128._0_4_);
  auVar132._0_8_ = CONCAT44(auVar98._8_4_,auVar129._8_4_);
  auVar132._8_4_ = auVar130._12_4_;
  auVar132._12_4_ = auVar111._12_4_;
  puVar43 = puVar41 + lVar40 * 4;
  uVar93 = *(undefined4 *)(puVar41 + lVar40 * 2);
  uVar7 = *(undefined4 *)(puVar41 + lVar40 * 6);
  auVar57._0_8_ = CONCAT44(uVar7,uVar93);
  uVar8 = *(undefined4 *)(p + lVar40 * 8 + -2);
  uVar9 = *(undefined4 *)puVar43;
  auVar114._0_8_ = CONCAT44(uVar9,uVar8);
  uVar10 = *(undefined4 *)(puVar41 + lVar40 * 7);
  uVar11 = *(undefined4 *)(puVar41 + lVar40 * 3);
  uVar159 = (undefined1)((uint)uVar10 >> 0x18);
  uVar71 = (undefined1)((uint)uVar7 >> 0x18);
  auVar63._8_6_ = 0;
  auVar63._0_8_ = auVar57._0_8_;
  auVar63[0xe] = uVar71;
  auVar63[0xf] = uVar159;
  auVar62._14_2_ = auVar63._14_2_;
  auVar62._8_5_ = 0;
  auVar62._0_8_ = auVar57._0_8_;
  auVar62[0xd] = (char)((uint)uVar10 >> 0x10);
  auVar61._13_3_ = auVar62._13_3_;
  auVar61._8_4_ = 0;
  auVar61._0_8_ = auVar57._0_8_;
  auVar61[0xc] = (char)((uint)uVar7 >> 0x10);
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._8_3_ = 0;
  auVar60._0_8_ = auVar57._0_8_;
  auVar60[0xb] = (char)((uint)uVar10 >> 8);
  auVar59._11_5_ = auVar60._11_5_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = auVar57._0_8_;
  auVar59[10] = (char)((uint)uVar7 >> 8);
  auVar58._10_6_ = auVar59._10_6_;
  auVar58[8] = 0;
  auVar58._0_8_ = auVar57._0_8_;
  auVar58[9] = (char)uVar10;
  auVar57._9_7_ = auVar58._9_7_;
  auVar57[8] = (char)uVar7;
  uVar157 = (undefined1)((uint)uVar11 >> 0x18);
  uVar67 = (undefined1)((uint)uVar93 >> 0x18);
  Var31 = CONCAT91(CONCAT81(auVar57._8_8_,uVar157),uVar67);
  auVar56._6_10_ = Var31;
  auVar56[5] = (char)((uint)uVar11 >> 0x10);
  auVar56[4] = (char)((uint)uVar93 >> 0x10);
  auVar56._0_4_ = uVar93;
  auVar35._2_12_ = auVar56._4_12_;
  auVar35[1] = (char)((uint)uVar11 >> 8);
  auVar35[0] = (char)((uint)uVar93 >> 8);
  uVar12 = *(undefined4 *)(puVar41 + lVar40 * 5);
  uVar13 = *(undefined4 *)(puVar41 + lVar40);
  uVar160 = (undefined1)((uint)uVar12 >> 0x18);
  uVar127 = (undefined1)((uint)uVar9 >> 0x18);
  auVar120._8_6_ = 0;
  auVar120._0_8_ = auVar114._0_8_;
  auVar120[0xe] = uVar127;
  auVar120[0xf] = uVar160;
  auVar119._14_2_ = auVar120._14_2_;
  auVar119._8_5_ = 0;
  auVar119._0_8_ = auVar114._0_8_;
  auVar119[0xd] = (char)((uint)uVar12 >> 0x10);
  auVar118._13_3_ = auVar119._13_3_;
  auVar118._8_4_ = 0;
  auVar118._0_8_ = auVar114._0_8_;
  auVar118[0xc] = (char)((uint)uVar9 >> 0x10);
  auVar117._12_4_ = auVar118._12_4_;
  auVar117._8_3_ = 0;
  auVar117._0_8_ = auVar114._0_8_;
  auVar117[0xb] = (char)((uint)uVar12 >> 8);
  auVar116._11_5_ = auVar117._11_5_;
  auVar116._8_2_ = 0;
  auVar116._0_8_ = auVar114._0_8_;
  auVar116[10] = (char)((uint)uVar9 >> 8);
  auVar115._10_6_ = auVar116._10_6_;
  auVar115[8] = 0;
  auVar115._0_8_ = auVar114._0_8_;
  auVar115[9] = (char)uVar12;
  auVar114._9_7_ = auVar115._9_7_;
  auVar114[8] = (char)uVar9;
  uVar158 = (undefined1)((uint)uVar13 >> 0x18);
  uVar125 = (undefined1)((uint)uVar8 >> 0x18);
  Var33 = CONCAT91(CONCAT81(auVar114._8_8_,uVar158),uVar125);
  auVar113._6_10_ = Var33;
  auVar113[5] = (char)((uint)uVar13 >> 0x10);
  auVar113[4] = (char)((uint)uVar8 >> 0x10);
  auVar113._0_4_ = uVar8;
  auVar36._2_12_ = auVar113._4_12_;
  auVar36[1] = (char)((uint)uVar13 >> 8);
  auVar36[0] = (char)((uint)uVar8 >> 8);
  auVar112._0_2_ = CONCAT11((char)uVar13,(char)uVar8);
  auVar112._2_14_ = auVar36;
  auVar143._0_12_ = auVar112._0_12_;
  auVar143._12_2_ = (short)Var33;
  auVar143._14_2_ = (short)Var31;
  auVar142._12_4_ = auVar143._12_4_;
  auVar142._0_10_ = auVar112._0_10_;
  auVar142._10_2_ = auVar56._4_2_;
  auVar141._10_6_ = auVar142._10_6_;
  auVar141._0_8_ = auVar112._0_8_;
  auVar141._8_2_ = auVar113._4_2_;
  auVar37._4_8_ = auVar141._8_8_;
  auVar37._2_2_ = auVar35._0_2_;
  auVar37._0_2_ = auVar36._0_2_;
  auVar140._0_4_ = CONCAT22(CONCAT11((char)uVar11,(char)uVar93),auVar112._0_2_);
  auVar140._4_12_ = auVar37;
  uVar94 = CONCAT22(auVar57._8_2_,auVar114._8_2_);
  auVar99._0_8_ = CONCAT26(auVar59._10_2_,CONCAT24(auVar116._10_2_,uVar94));
  auVar99._8_2_ = auVar118._12_2_;
  auVar99._10_2_ = auVar61._12_2_;
  auVar121._12_2_ = auVar119._14_2_;
  auVar121._0_12_ = auVar99;
  auVar121._14_2_ = auVar62._14_2_;
  auVar161._0_8_ = auVar140._0_8_;
  auVar161._8_4_ = auVar37._0_4_;
  auVar161._12_4_ = (int)((ulong)auVar99._0_8_ >> 0x20);
  auVar64._12_4_ = uVar94;
  auVar64._8_4_ = auVar140._0_4_;
  auVar144._0_8_ = CONCAT44(auVar99._8_4_,auVar141._8_4_);
  auVar144._8_4_ = auVar142._12_4_;
  auVar144._12_4_ = auVar121._12_4_;
  auVar64._0_8_ = auVar76._0_8_;
  auVar149._8_8_ = auVar161._8_8_;
  auVar149._0_8_ = auVar76._8_8_;
  auVar122._8_8_ = auVar144._0_8_;
  auVar122._0_8_ = auVar132._0_8_;
  auVar133._8_8_ = auVar144._8_8_;
  auVar133._0_8_ = auVar132._8_8_;
  uVar167 = (undefined1)((uint)thresh >> 0x18);
  uVar166 = (undefined1)((uint)thresh >> 0x10);
  uVar165 = (undefined1)((uint)thresh >> 8);
  auVar162._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar167,uVar167),uVar166),CONCAT14(uVar166,thresh)) >> 0x20)
  ;
  auVar162[3] = uVar165;
  auVar162[2] = uVar165;
  auVar162[0] = (undefined1)thresh;
  auVar162[1] = auVar162[0];
  auVar162._8_8_ = 0;
  auVar163 = pshuflw(auVar162,auVar162,0);
  auVar164 = psubusb(auVar133,auVar64);
  auVar182 = psubusb(auVar64,auVar133);
  auVar182 = auVar182 | auVar164;
  auVar183._0_2_ = auVar182._0_2_ >> 1;
  auVar183._2_2_ = auVar182._2_2_ >> 1;
  auVar183._4_2_ = auVar182._4_2_ >> 1;
  auVar183._6_2_ = auVar182._6_2_ >> 1;
  auVar183._8_2_ = auVar182._8_2_ >> 1;
  auVar183._10_2_ = auVar182._10_2_ >> 1;
  auVar183._12_2_ = auVar182._12_2_ >> 1;
  auVar183._14_2_ = auVar182._14_2_ >> 1;
  auVar164 = psubusb(auVar122,auVar149);
  auVar182 = psubusb(auVar149,auVar122);
  auVar164 = paddusb(auVar182 | auVar164,auVar182 | auVar164);
  auVar164 = paddusb(auVar183 & _DAT_00156010,auVar164);
  auVar182 = psubsb(auVar64 ^ _DAT_00155090,auVar133 ^ _DAT_00155090);
  auVar193 = psubsb(auVar122 ^ _DAT_00155090,auVar149 ^ _DAT_00155090);
  auVar182 = paddsb(auVar182,auVar193);
  auVar182 = paddsb(auVar182,auVar193);
  auVar182 = paddsb(auVar182,auVar193);
  bVar14 = auVar164[0];
  bVar168 = auVar163[0];
  bVar15 = auVar164[1];
  bVar179 = auVar163[1];
  bVar16 = auVar164[2];
  bVar180 = auVar163[2];
  bVar17 = auVar164[3];
  bVar181 = auVar163[3];
  bVar18 = auVar164[4];
  bVar19 = auVar164[5];
  bVar20 = auVar164[6];
  bVar21 = auVar164[7];
  bVar22 = auVar164[8];
  bVar23 = auVar164[9];
  bVar24 = auVar164[10];
  bVar25 = auVar164[0xb];
  bVar26 = auVar164[0xc];
  bVar27 = auVar164[0xd];
  bVar28 = auVar164[0xe];
  bVar29 = auVar164[0xf];
  auVar169[0] = -((byte)((bVar14 < bVar168) * bVar14 | (bVar14 >= bVar168) * bVar168) == bVar14);
  auVar169[1] = -((byte)((bVar15 < bVar179) * bVar15 | (bVar15 >= bVar179) * bVar179) == bVar15);
  auVar169[2] = -((byte)((bVar16 < bVar180) * bVar16 | (bVar16 >= bVar180) * bVar180) == bVar16);
  auVar169[3] = -((byte)((bVar17 < bVar181) * bVar17 | (bVar17 >= bVar181) * bVar181) == bVar17);
  auVar169[4] = -((byte)((bVar18 < bVar168) * bVar18 | (bVar18 >= bVar168) * bVar168) == bVar18);
  auVar169[5] = -((byte)((bVar19 < bVar179) * bVar19 | (bVar19 >= bVar179) * bVar179) == bVar19);
  auVar169[6] = -((byte)((bVar20 < bVar180) * bVar20 | (bVar20 >= bVar180) * bVar180) == bVar20);
  auVar169[7] = -((byte)((bVar21 < bVar181) * bVar21 | (bVar21 >= bVar181) * bVar181) == bVar21);
  auVar169[8] = -((byte)((bVar22 < bVar168) * bVar22 | (bVar22 >= bVar168) * bVar168) == bVar22);
  auVar169[9] = -((byte)((bVar23 < bVar179) * bVar23 | (bVar23 >= bVar179) * bVar179) == bVar23);
  auVar169[10] = -((byte)((bVar24 < bVar180) * bVar24 | (bVar24 >= bVar180) * bVar180) == bVar24);
  auVar169[0xb] = -((byte)((bVar25 < bVar181) * bVar25 | (bVar25 >= bVar181) * bVar181) == bVar25);
  auVar169[0xc] = -((byte)((bVar26 < bVar168) * bVar26 | (bVar26 >= bVar168) * bVar168) == bVar26);
  auVar169[0xd] = -((byte)((bVar27 < bVar179) * bVar27 | (bVar27 >= bVar179) * bVar179) == bVar27);
  auVar169[0xe] = -((byte)((bVar28 < bVar180) * bVar28 | (bVar28 >= bVar180) * bVar180) == bVar28);
  auVar169[0xf] = -((byte)((bVar29 < bVar181) * bVar29 | (bVar29 >= bVar181) * bVar181) == bVar29);
  auVar164 = paddsb(_DAT_00156020,auVar169 & auVar182);
  auVar163 = paddsb(auVar169 & auVar182,_DAT_00156030);
  auVar192._0_14_ = auVar182._0_14_;
  auVar192[0xe] = auVar182[7];
  auVar192[0xf] = auVar163[7];
  auVar191._14_2_ = auVar192._14_2_;
  auVar191._0_13_ = auVar182._0_13_;
  auVar191[0xd] = auVar163[6];
  auVar190._13_3_ = auVar191._13_3_;
  auVar190._0_12_ = auVar182._0_12_;
  auVar190[0xc] = auVar182[6];
  auVar189._12_4_ = auVar190._12_4_;
  auVar189._0_11_ = auVar182._0_11_;
  auVar189[0xb] = auVar163[5];
  auVar188._11_5_ = auVar189._11_5_;
  auVar188._0_10_ = auVar182._0_10_;
  auVar188[10] = auVar182[5];
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._0_9_ = auVar182._0_9_;
  auVar187[9] = auVar163[4];
  auVar186._9_7_ = auVar187._9_7_;
  auVar186._0_8_ = auVar182._0_8_;
  auVar186[8] = auVar182[4];
  auVar185._8_8_ = auVar186._8_8_;
  auVar185[7] = auVar163[3];
  auVar185[6] = auVar182[3];
  auVar185[5] = auVar163[2];
  auVar185[4] = auVar182[2];
  auVar185[3] = auVar163[1];
  auVar185[2] = auVar182[1];
  auVar185[0] = auVar182[0];
  auVar185[1] = auVar163[0];
  auVar170[1] = auVar163[8];
  auVar170[0] = auVar163[8];
  auVar170[2] = auVar163[9];
  auVar170[3] = auVar163[9];
  auVar170[4] = auVar163[10];
  auVar170[5] = auVar163[10];
  auVar170[6] = auVar163[0xb];
  auVar170[7] = auVar163[0xb];
  auVar170[8] = auVar163[0xc];
  auVar170[9] = auVar163[0xc];
  auVar170[10] = auVar163[0xd];
  auVar170[0xb] = auVar163[0xd];
  auVar170[0xc] = auVar163[0xe];
  auVar170[0xd] = auVar163[0xe];
  auVar170[0xf] = auVar163[0xf];
  auVar170[0xe] = auVar170[0xf];
  auVar182 = psraw(auVar185,0xb);
  auVar163 = psraw(auVar170,0xb);
  auVar182 = packsswb(auVar182,auVar163);
  auVar178._0_14_ = auVar163._0_14_;
  auVar178[0xe] = auVar163[7];
  auVar178[0xf] = auVar164[7];
  auVar177._14_2_ = auVar178._14_2_;
  auVar177._0_13_ = auVar163._0_13_;
  auVar177[0xd] = auVar164[6];
  auVar176._13_3_ = auVar177._13_3_;
  auVar176._0_12_ = auVar163._0_12_;
  auVar176[0xc] = auVar163[6];
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._0_11_ = auVar163._0_11_;
  auVar175[0xb] = auVar164[5];
  auVar174._11_5_ = auVar175._11_5_;
  auVar174._0_10_ = auVar163._0_10_;
  auVar174[10] = auVar163[5];
  auVar173._10_6_ = auVar174._10_6_;
  auVar173._0_9_ = auVar163._0_9_;
  auVar173[9] = auVar164[4];
  auVar172._9_7_ = auVar173._9_7_;
  auVar172._0_8_ = auVar163._0_8_;
  auVar172[8] = auVar163[4];
  auVar171._8_8_ = auVar172._8_8_;
  auVar171[7] = auVar164[3];
  auVar171[6] = auVar163[3];
  auVar171[5] = auVar164[2];
  auVar171[4] = auVar163[2];
  auVar171[3] = auVar164[1];
  auVar171[2] = auVar163[1];
  auVar171[0] = auVar163[0];
  auVar171[1] = auVar164[0];
  auVar184[1] = auVar164[8];
  auVar184[0] = auVar164[8];
  auVar184[2] = auVar164[9];
  auVar184[3] = auVar164[9];
  auVar184[4] = auVar164[10];
  auVar184[5] = auVar164[10];
  auVar184[6] = auVar164[0xb];
  auVar184[7] = auVar164[0xb];
  auVar184[8] = auVar164[0xc];
  auVar184[9] = auVar164[0xc];
  auVar184[10] = auVar164[0xd];
  auVar184[0xb] = auVar164[0xd];
  auVar184[0xc] = auVar164[0xe];
  auVar184[0xd] = auVar164[0xe];
  auVar184[0xf] = auVar164[0xf];
  auVar184[0xe] = auVar184[0xf];
  auVar163 = psraw(auVar171,0xb);
  auVar164 = psraw(auVar184,0xb);
  auVar164 = packsswb(auVar163,auVar164);
  auVar163 = psubsb(auVar122 ^ _DAT_00155090,auVar182);
  auVar164 = paddsb(auVar164,auVar149 ^ _DAT_00155090);
  auVar164 = auVar164 ^ _DAT_00155090;
  auVar87._0_14_ = auVar76._0_14_;
  auVar87[0xe] = (char)uVar4;
  auVar87[0xf] = auVar164[7];
  auVar86._14_2_ = auVar87._14_2_;
  auVar86._0_13_ = auVar76._0_13_;
  auVar86[0xd] = auVar164[6];
  auVar85._13_3_ = auVar86._13_3_;
  auVar85._0_12_ = auVar76._0_12_;
  auVar85[0xc] = (char)uVar95;
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._0_11_ = auVar76._0_11_;
  auVar84[0xb] = auVar164[5];
  auVar83._11_5_ = auVar84._11_5_;
  auVar83._0_10_ = auVar76._0_10_;
  auVar83[10] = (char)uVar6;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._0_9_ = auVar76._0_9_;
  auVar82[9] = auVar164[4];
  auVar81._9_7_ = auVar82._9_7_;
  auVar81[8] = (char)uVar1;
  auVar81._0_8_ = auVar76._0_8_;
  Var31 = CONCAT91(CONCAT81(auVar81._8_8_,auVar164[3]),(char)uVar3);
  auVar80._6_10_ = Var31;
  auVar80[5] = auVar164[2];
  auVar80[4] = (char)uVar47;
  auVar80._0_4_ = auVar128._0_4_;
  auVar79._4_12_ = auVar80._4_12_;
  auVar79[3] = auVar164[1];
  auVar79[2] = (char)uVar5;
  auVar79._0_2_ = auVar102._0_2_;
  auVar78._2_14_ = auVar79._2_14_;
  auVar78._0_2_ = CONCAT11(auVar164[0],(char)uVar2);
  uVar46 = CONCAT11(auVar164[8],(char)uVar8);
  uVar47 = CONCAT13(auVar164[9],CONCAT12((char)uVar13,uVar46));
  uVar48 = CONCAT15(auVar164[10],CONCAT14((char)uVar93,uVar47));
  uVar49 = CONCAT17(auVar164[0xb],CONCAT16((char)uVar11,uVar48));
  auVar50._0_10_ = CONCAT19(auVar164[0xc],CONCAT18((char)uVar9,uVar49));
  auVar50[10] = (char)uVar12;
  auVar50[0xb] = auVar164[0xd];
  auVar51[0xc] = (char)uVar7;
  auVar51._0_12_ = auVar50;
  auVar51[0xd] = auVar164[0xe];
  auVar65[0xe] = (char)uVar10;
  auVar65._0_14_ = auVar51;
  auVar65[0xf] = auVar164[0xf];
  auVar163 = auVar163 ^ _DAT_00155090;
  auVar156._0_14_ = auVar163._0_14_;
  auVar156[0xe] = auVar163[7];
  auVar156[0xf] = uVar90;
  auVar155._14_2_ = auVar156._14_2_;
  auVar155._0_13_ = auVar163._0_13_;
  auVar155[0xd] = uVar70;
  auVar154._13_3_ = auVar155._13_3_;
  auVar154._0_12_ = auVar163._0_12_;
  auVar154[0xc] = auVar163[6];
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._0_11_ = auVar163._0_11_;
  auVar153[0xb] = uVar91;
  auVar152._11_5_ = auVar153._11_5_;
  auVar152._0_10_ = auVar163._0_10_;
  auVar152[10] = auVar163[5];
  auVar151._10_6_ = auVar152._10_6_;
  auVar151._0_9_ = auVar163._0_9_;
  auVar151[9] = uVar126;
  auVar150._9_7_ = auVar151._9_7_;
  auVar150._0_8_ = auVar163._0_8_;
  auVar150[8] = auVar163[4];
  Var33 = CONCAT91(CONCAT81(auVar150._8_8_,uVar88),auVar163[3]);
  auVar39._2_10_ = Var33;
  auVar39[1] = uVar66;
  auVar39[0] = auVar163[2];
  auVar38._2_12_ = auVar39;
  auVar38[1] = uVar89;
  auVar38[0] = auVar163[1];
  auVar148[3] = uVar124;
  auVar148[2] = auVar163[0];
  uVar92 = CONCAT11(uVar125,auVar163[8]);
  uVar95 = CONCAT13(uVar158,CONCAT12(auVar163[9],uVar92));
  uVar96 = CONCAT15(uVar67,CONCAT14(auVar163[10],uVar95));
  uVar97 = CONCAT17(uVar157,CONCAT16(auVar163[0xb],uVar96));
  auVar100._0_10_ = CONCAT19(uVar127,CONCAT18(auVar163[0xc],uVar97));
  auVar100[10] = auVar163[0xd];
  auVar100[0xb] = uVar160;
  auVar101[0xc] = auVar163[0xe];
  auVar101._0_12_ = auVar100;
  auVar101[0xd] = uVar71;
  auVar123[0xe] = auVar163[0xf];
  auVar123._0_14_ = auVar101;
  auVar123[0xf] = uVar159;
  auVar147._0_12_ = auVar78._0_12_;
  auVar147._12_2_ = (short)Var31;
  auVar147._14_2_ = (short)Var33;
  auVar146._12_4_ = auVar147._12_4_;
  auVar146._0_10_ = auVar78._0_10_;
  auVar146._10_2_ = auVar39._0_2_;
  auVar145._10_6_ = auVar146._10_6_;
  auVar145._0_8_ = auVar78._0_8_;
  auVar145._8_2_ = auVar80._4_2_;
  auVar148._8_8_ = auVar145._8_8_;
  auVar148._6_2_ = auVar38._0_2_;
  auVar148._4_2_ = auVar79._2_2_;
  auVar148._0_2_ = auVar78._0_2_;
  auVar138._12_2_ = (short)((ulong)uVar49 >> 0x30);
  auVar138._0_12_ = auVar50;
  auVar138._14_2_ = (short)((ulong)uVar97 >> 0x30);
  auVar137._12_4_ = auVar138._12_4_;
  auVar137._10_2_ = (short)((uint6)uVar96 >> 0x20);
  auVar137._0_10_ = auVar50._0_10_;
  auVar136._10_6_ = auVar137._10_6_;
  auVar136._8_2_ = (short)((uint6)uVar48 >> 0x20);
  auVar136._0_8_ = uVar49;
  auVar135._8_8_ = auVar136._8_8_;
  auVar135._6_2_ = (short)((uint)uVar95 >> 0x10);
  auVar135._0_6_ = uVar48;
  auVar134._6_10_ = auVar135._6_10_;
  auVar134._4_2_ = (short)((uint)uVar47 >> 0x10);
  auVar134._0_4_ = uVar47;
  auVar139._4_12_ = auVar134._4_12_;
  auVar139._2_2_ = uVar92;
  auVar139._0_2_ = uVar46;
  iVar42 = 4;
  do {
    *(int *)puVar45 = auVar148._0_4_;
    auVar148 = auVar148 >> 0x20;
    puVar45 = puVar45 + lVar40;
    iVar42 = iVar42 + -1;
  } while (iVar42 != 0);
  iVar42 = 4;
  uVar46 = auVar81._8_2_;
  uVar92 = auVar150._8_2_;
  uVar68 = auVar83._10_2_;
  uVar69 = auVar152._10_2_;
  uVar72 = auVar85._12_2_;
  uVar73 = auVar154._12_2_;
  uVar74 = auVar86._14_2_;
  uVar75 = auVar155._14_2_;
  do {
    *(undefined2 *)puVar44 = uVar46;
    *(undefined2 *)(puVar44 + 2) = uVar92;
    puVar44 = puVar44 + lVar40;
    iVar42 = iVar42 + -1;
    uVar46 = uVar68;
    uVar92 = uVar69;
    uVar68 = uVar72;
    uVar69 = uVar73;
    uVar72 = uVar74;
    uVar73 = uVar75;
    uVar74 = 0;
    uVar75 = 0;
  } while (iVar42 != 0);
  iVar42 = 4;
  do {
    *(int *)puVar41 = auVar139._0_4_;
    auVar139 = auVar139 >> 0x20;
    puVar41 = puVar41 + lVar40;
    iVar42 = iVar42 + -1;
  } while (iVar42 != 0);
  iVar42 = 4;
  uVar46 = (short)((unkuint10)auVar50._0_10_ >> 0x40);
  uVar92 = (short)((unkuint10)auVar100._0_10_ >> 0x40);
  uVar68 = auVar50._10_2_;
  uVar69 = auVar100._10_2_;
  uVar72 = auVar51._12_2_;
  uVar73 = auVar101._12_2_;
  uVar74 = auVar65._14_2_;
  uVar75 = auVar123._14_2_;
  do {
    *(undefined2 *)puVar43 = uVar46;
    *(undefined2 *)(puVar43 + 2) = uVar92;
    puVar43 = puVar43 + lVar40;
    iVar42 = iVar42 + -1;
    uVar46 = uVar68;
    uVar92 = uVar69;
    uVar68 = uVar72;
    uVar69 = uVar73;
    uVar72 = uVar74;
    uVar73 = uVar75;
    uVar74 = 0;
    uVar75 = 0;
  } while (iVar42 != 0);
  return;
}

Assistant:

static void SimpleHFilter16_SSE2(uint8_t* p, int stride, int thresh) {
  __m128i p1, p0, q0, q1;

  p -= 2;  // beginning of p1

  Load16x4_SSE2(p, p + 8 * stride, stride, &p1, &p0, &q0, &q1);
  DoFilter2_SSE2(&p1, &p0, &q0, &q1, thresh);
  Store16x4_SSE2(&p1, &p0, &q0, &q1, p, p + 8 * stride, stride);
}